

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.h
# Opt level: O3

bool pbrt::RealisticCamera::IntersectSphericalElement
               (Float radius,Float zCenter,Ray *ray,Float *t,Normal3f *n)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar4;
  undefined8 uVar3;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 extraout_var [60];
  
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = radius;
  uVar2._0_4_ = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  uVar2._4_4_ = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar2;
  fVar11 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  fVar12 = (ray->o).super_Tuple3<pbrt::Point3,_float>.z - zCenter;
  fVar15 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar8 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6 = vmovshdup_avx(auVar18);
  fVar7 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar15)),ZEXT416((uint)fVar8),
                           ZEXT416((uint)fVar8));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar15)),auVar18,ZEXT416((uint)fVar8));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),ZEXT416((uint)fVar11));
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
  fVar8 = auVar6._0_4_;
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar18,auVar18);
  fVar11 = auVar13._0_4_ + auVar13._0_4_;
  auVar6 = vfmadd231ss_fma(auVar6,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  auVar18 = vfnmadd231ss_fma(auVar6,auVar9._0_16_,auVar9._0_16_);
  auVar13 = ZEXT416((uint)(auVar18._0_4_ * fVar8 * 4.0));
  auVar6 = vfmsub213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),auVar13);
  auVar13 = vfnmadd213ss_fma(ZEXT416((uint)(fVar8 * 4.0)),auVar18,auVar13);
  fVar15 = auVar6._0_4_ + auVar13._0_4_;
  if (0.0 <= fVar15) {
    if (fVar15 < 0.0) {
      auVar10._0_4_ = sqrtf(fVar15);
      auVar10._4_60_ = extraout_var;
      auVar6 = auVar10._0_16_;
    }
    else {
      auVar6 = vsqrtss_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
    }
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      auVar13._8_4_ = 0x7fffffff;
      auVar13._0_8_ = 0x7fffffff7fffffff;
      auVar13._12_4_ = 0x7fffffff;
      auVar6 = vpternlogd_avx512vl(auVar6,ZEXT416((uint)fVar11),auVar13,0xe4);
      fVar15 = (fVar11 + auVar6._0_4_) * -0.5;
      fVar8 = fVar15 / fVar8;
      fVar15 = auVar18._0_4_ / fVar15;
      fVar11 = fVar8;
      if (fVar15 < fVar8) {
        fVar11 = fVar15;
        fVar15 = fVar8;
      }
    }
    else {
      auVar6._8_4_ = 0x80000000;
      auVar6._0_8_ = 0x8000000080000000;
      auVar6._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(auVar18,auVar6);
      fVar11 = auVar6._0_4_ / fVar11;
      fVar15 = fVar11;
    }
    if (radius < 0.0 == 0.0 < (ray->d).super_Tuple3<pbrt::Vector3,_float>.z) {
      bVar5 = fVar15 < fVar11;
    }
    else {
      bVar5 = fVar11 < fVar15;
    }
    fVar11 = (float)((uint)(!bVar5 && fVar11 != fVar15) * (int)fVar15 +
                    (uint)(bVar5 || fVar11 == fVar15) * (int)fVar11);
    *t = fVar11;
    if (0.0 <= fVar11) {
      uVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
      uVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
      fVar12 = fVar12 + fVar11 * (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar19._0_4_ = (float)(undefined4)uVar2 + fVar11 * (float)uVar1;
      auVar19._4_4_ = (float)uVar2._4_4_ + fVar11 * (float)uVar4;
      auVar19._8_4_ = fVar11 * 0.0 + 0.0;
      auVar19._12_4_ = fVar11 * 0.0 + 0.0;
      auVar14._0_4_ = auVar19._0_4_ * auVar19._0_4_;
      auVar14._4_4_ = auVar19._4_4_ * auVar19._4_4_;
      auVar14._8_4_ = auVar19._8_4_ * auVar19._8_4_;
      auVar14._12_4_ = auVar19._12_4_ * auVar19._12_4_;
      uVar3 = vmovlps_avx(auVar19);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar3;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar3 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z = fVar12;
      fVar11 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6 = vhaddps_avx(auVar14,auVar14);
      auVar6 = ZEXT416((uint)(auVar6._0_4_ + fVar12 * fVar12));
      auVar6 = vsqrtss_avx(auVar6,auVar6);
      fVar15 = auVar6._0_4_;
      fVar12 = fVar12 / fVar15;
      auVar16._4_4_ = fVar15;
      auVar16._0_4_ = fVar15;
      auVar16._8_4_ = fVar15;
      auVar16._12_4_ = fVar15;
      auVar6 = vdivps_avx(auVar19,auVar16);
      auVar17 = ZEXT416((uint)(fVar12 * -fVar11));
      auVar18 = vfnmsub213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar12),auVar17);
      auVar13 = vmovshdup_avx(auVar6);
      auVar13 = vfnmadd132ss_fma(auVar13,auVar17,
                                 ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.y));
      auVar13 = vfnmadd132ss_fma(auVar6,ZEXT416((uint)(auVar13._0_4_ + auVar18._0_4_)),
                                 ZEXT416((uint)(ray->d).super_Tuple3<pbrt::Vector3,_float>.x));
      auVar17 = auVar6;
      if (auVar13._0_4_ < 0.0) {
        auVar17._0_8_ = auVar6._0_8_ ^ 0x8000000080000000;
        auVar17._8_4_ = auVar6._8_4_ ^ 0x80000000;
        auVar17._12_4_ = auVar6._12_4_ ^ 0x80000000;
      }
      uVar3 = vcmpss_avx512f(auVar13,ZEXT816(0) << 0x40,1);
      bVar5 = (bool)((byte)uVar3 & 1);
      uVar3 = vmovlps_avx(auVar17);
      (n->super_Tuple3<pbrt::Normal3,_float>).x = (float)(int)uVar3;
      (n->super_Tuple3<pbrt::Normal3,_float>).y = (float)(int)((ulong)uVar3 >> 0x20);
      (n->super_Tuple3<pbrt::Normal3,_float>).z =
           (float)((uint)bVar5 * (int)-fVar12 + (uint)!bVar5 * (int)fVar12);
      return true;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    static bool IntersectSphericalElement(Float radius, Float zCenter, const Ray &ray,
                                          Float *t, Normal3f *n) {
        // Compute _t0_ and _t1_ for ray--element intersection
        Point3f o = ray.o - Vector3f(0, 0, zCenter);
        Float A = ray.d.x * ray.d.x + ray.d.y * ray.d.y + ray.d.z * ray.d.z;
        Float B = 2 * (ray.d.x * o.x + ray.d.y * o.y + ray.d.z * o.z);
        Float C = o.x * o.x + o.y * o.y + o.z * o.z - radius * radius;
        Float t0, t1;
        if (!Quadratic(A, B, C, &t0, &t1))
            return false;

        // Select intersection $t$ based on ray direction and element curvature
        bool useCloserT = (ray.d.z > 0) ^ (radius < 0);
        *t = useCloserT ? std::min(t0, t1) : std::max(t0, t1);
        if (*t < 0)
            return false;

        // Compute surface normal of element at ray intersection point
        *n = Normal3f(Vector3f(o + *t * ray.d));
        *n = FaceForward(Normalize(*n), -ray.d);

        return true;
    }